

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

bool QStyleSheetStyle::isNaturalChild(QObject *obj)

{
  undefined1 uVar1;
  long in_FS_OFFSET;
  QLatin1String QVar2;
  QArrayData *local_30 [3];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::objectName();
  QVar2.m_data = (char *)0x3;
  QVar2.m_size = (qsizetype)local_30;
  uVar1 = QString::startsWith(QVar2,0x68064f);
  if (local_30[0] != (QArrayData *)0x0) {
    LOCK();
    (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_30[0],2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QStyleSheetStyle::isNaturalChild(const QObject *obj)
{
    if (obj->objectName().startsWith("qt_"_L1))
        return true;

    return false;
}